

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O1

btBroadphasePair * __thiscall
btHashedOverlappingPairCache::internalAddPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  btOverlappingPairCallback *pbVar4;
  int *piVar5;
  undefined8 uVar6;
  int proxyId1;
  btBroadphasePair *pbVar7;
  long lVar8;
  int proxyId2;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  btBroadphasePair *pbVar14;
  btBroadphaseProxy *pbVar15;
  btBroadphaseProxy *pbVar16;
  
  pbVar15 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pbVar15 = proxy0;
    proxy0 = proxy1;
  }
  uVar11 = pbVar15->m_uniqueId << 0x10 | proxy0->m_uniqueId;
  uVar11 = ~(uVar11 << 0xf) + uVar11;
  uVar11 = ((int)uVar11 >> 10 ^ uVar11) * 9;
  uVar11 = (int)uVar11 >> 6 ^ uVar11;
  uVar11 = ~(uVar11 << 0xb) + uVar11;
  uVar11 = (int)uVar11 >> 0x10 ^ uVar11;
  iVar3 = (this->m_overlappingPairArray).m_capacity;
  uVar12 = iVar3 - 1U & uVar11;
  iVar13 = (this->m_hashTable).m_data[(int)uVar12];
  if (iVar13 != -1) {
    pbVar7 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pbVar7[iVar13].m_pProxy0)->m_uniqueId == proxy0->m_uniqueId) &&
         (pbVar14 = pbVar7 + iVar13, pbVar14->m_pProxy1->m_uniqueId == pbVar15->m_uniqueId))
      goto LAB_001383f2;
      iVar13 = (this->m_next).m_data[iVar13];
    } while (iVar13 != -1);
  }
  pbVar14 = (btBroadphasePair *)0x0;
LAB_001383f2:
  if (pbVar14 == (btBroadphasePair *)0x0) {
    iVar13 = (this->m_overlappingPairArray).m_size;
    if (iVar13 == iVar3) {
      iVar9 = 1;
      if (iVar13 != 0) {
        iVar9 = iVar13 * 2;
      }
      if (iVar3 < iVar9) {
        if (iVar9 == 0) {
          pbVar7 = (btBroadphasePair *)0x0;
        }
        else {
          pbVar7 = (btBroadphasePair *)btAlignedAllocInternal((long)iVar9 << 5,0x10);
        }
        lVar8 = (long)(this->m_overlappingPairArray).m_size;
        if (0 < lVar8) {
          lVar10 = 0;
          do {
            pbVar14 = (this->m_overlappingPairArray).m_data;
            puVar1 = (undefined8 *)((long)&pbVar14->m_pProxy0 + lVar10);
            uVar6 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pbVar7->m_pProxy0 + lVar10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar6;
            *(undefined8 *)((long)&pbVar7->m_algorithm + lVar10) =
                 *(undefined8 *)((long)&pbVar14->m_algorithm + lVar10);
            *(undefined8 *)((long)&pbVar7->field_3 + lVar10) =
                 *(undefined8 *)((long)&pbVar14->field_3 + lVar10);
            lVar10 = lVar10 + 0x20;
          } while (lVar8 * 0x20 != lVar10);
        }
        pbVar14 = (this->m_overlappingPairArray).m_data;
        if (pbVar14 != (btBroadphasePair *)0x0) {
          if ((this->m_overlappingPairArray).m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar14);
          }
          (this->m_overlappingPairArray).m_data = (btBroadphasePair *)0x0;
        }
        (this->m_overlappingPairArray).m_ownsMemory = true;
        (this->m_overlappingPairArray).m_data = pbVar7;
        (this->m_overlappingPairArray).m_capacity = iVar9;
      }
    }
    piVar5 = &(this->m_overlappingPairArray).m_size;
    *piVar5 = *piVar5 + 1;
    pbVar14 = (this->m_overlappingPairArray).m_data + iVar13;
    pbVar4 = this->m_ghostPairCallback;
    if (pbVar4 != (btOverlappingPairCallback *)0x0) {
      (*pbVar4->_vptr_btOverlappingPairCallback[2])(pbVar4,proxy0,pbVar15);
    }
    if (iVar3 < (this->m_overlappingPairArray).m_capacity) {
      growTables(this);
      uVar12 = (this->m_overlappingPairArray).m_capacity - 1U & uVar11;
    }
    pbVar16 = proxy0;
    if (proxy0->m_uniqueId < pbVar15->m_uniqueId) {
      pbVar16 = pbVar15;
      pbVar15 = proxy0;
    }
    pbVar14->m_pProxy0 = pbVar15;
    pbVar14->m_pProxy1 = pbVar16;
    pbVar14->m_algorithm = (btCollisionAlgorithm *)0x0;
    (pbVar14->field_3).m_internalInfo1 = (void *)0x0;
    piVar5 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar13] = piVar5[(int)uVar12];
    piVar5[(int)uVar12] = iVar13;
  }
  return pbVar14;
}

Assistant:

btBroadphasePair* btHashedOverlappingPairCache::internalAddPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1)
{
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));	// New hash value with new mask


	btBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair != NULL)
	{
		return pair;
	}
	/*for(int i=0;i<m_overlappingPairArray.size();++i)
		{
		if(	(m_overlappingPairArray[i].m_pProxy0==proxy0)&&
			(m_overlappingPairArray[i].m_pProxy1==proxy1))
			{
			printf("Adding duplicated %u<>%u\r\n",proxyId1,proxyId2);
			internalFindPair(proxy0, proxy1, hash);
			}
		}*/
	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	//this is where we add an actual pair, so also call the 'ghost'
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0,proxy1);

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));
	}
	
	pair = new (mem) btBroadphasePair(*proxy0,*proxy1);
//	pair->m_pProxy0 = proxy0;
//	pair->m_pProxy1 = proxy1;
	pair->m_algorithm = 0;
	pair->m_internalTmpValue = 0;
	

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}